

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv_run(uv_loop_t *loop,uv_run_mode mode)

{
  bool bVar1;
  int local_1c;
  int can_sleep;
  int r;
  int timeout;
  uv_run_mode mode_local;
  uv_loop_t *loop_local;
  
  local_1c = uv__loop_alive(loop);
  if (local_1c == 0) {
    uv__update_time(loop);
  }
  while( true ) {
    bVar1 = false;
    if (local_1c != 0) {
      bVar1 = loop->stop_flag == 0;
    }
    if (!bVar1) break;
    uv__update_time(loop);
    uv__run_timers(loop);
    bVar1 = false;
    if (loop->pending_queue == (void **)loop->pending_queue[0]) {
      bVar1 = loop->idle_handles == (void **)loop->idle_handles[0];
    }
    uv__run_pending(loop);
    uv__run_idle(loop);
    uv__run_prepare(loop);
    can_sleep = 0;
    if (((mode == UV_RUN_ONCE) && (bVar1)) || (mode == UV_RUN_DEFAULT)) {
      can_sleep = uv__backend_timeout(loop);
    }
    uv__io_poll(loop,can_sleep);
    local_1c = 0;
    while( true ) {
      bVar1 = false;
      if (local_1c < 8) {
        bVar1 = loop->pending_queue != (void **)loop->pending_queue[0];
      }
      if (!bVar1) break;
      uv__run_pending(loop);
      local_1c = local_1c + 1;
    }
    uv__metrics_update_idle_time(loop);
    uv__run_check(loop);
    uv__run_closing_handles(loop);
    if (mode == UV_RUN_ONCE) {
      uv__update_time(loop);
      uv__run_timers(loop);
    }
    local_1c = uv__loop_alive(loop);
    if ((mode == UV_RUN_ONCE) || (mode == UV_RUN_NOWAIT)) break;
  }
  if (loop->stop_flag != 0) {
    loop->stop_flag = 0;
  }
  return local_1c;
}

Assistant:

int uv_run(uv_loop_t* loop, uv_run_mode mode) {
  int timeout;
  int r;
  int can_sleep;

  r = uv__loop_alive(loop);
  if (!r)
    uv__update_time(loop);

  while (r != 0 && loop->stop_flag == 0) {
    uv__update_time(loop);
    uv__run_timers(loop);

    can_sleep =
        QUEUE_EMPTY(&loop->pending_queue) && QUEUE_EMPTY(&loop->idle_handles);

    uv__run_pending(loop);
    uv__run_idle(loop);
    uv__run_prepare(loop);

    timeout = 0;
    if ((mode == UV_RUN_ONCE && can_sleep) || mode == UV_RUN_DEFAULT)
      timeout = uv__backend_timeout(loop);

    uv__io_poll(loop, timeout);

    /* Process immediate callbacks (e.g. write_cb) a small fixed number of
     * times to avoid loop starvation.*/
    for (r = 0; r < 8 && !QUEUE_EMPTY(&loop->pending_queue); r++)
      uv__run_pending(loop);

    /* Run one final update on the provider_idle_time in case uv__io_poll
     * returned because the timeout expired, but no events were received. This
     * call will be ignored if the provider_entry_time was either never set (if
     * the timeout == 0) or was already updated b/c an event was received.
     */
    uv__metrics_update_idle_time(loop);

    uv__run_check(loop);
    uv__run_closing_handles(loop);

    if (mode == UV_RUN_ONCE) {
      /* UV_RUN_ONCE implies forward progress: at least one callback must have
       * been invoked when it returns. uv__io_poll() can return without doing
       * I/O (meaning: no callbacks) when its timeout expires - which means we
       * have pending timers that satisfy the forward progress constraint.
       *
       * UV_RUN_NOWAIT makes no guarantees about progress so it's omitted from
       * the check.
       */
      uv__update_time(loop);
      uv__run_timers(loop);
    }

    r = uv__loop_alive(loop);
    if (mode == UV_RUN_ONCE || mode == UV_RUN_NOWAIT)
      break;
  }

  /* The if statement lets gcc compile it to a conditional store. Avoids
   * dirtying a cache line.
   */
  if (loop->stop_flag != 0)
    loop->stop_flag = 0;

  return r;
}